

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall LowererMD::Simd128LowerLdLane(LowererMD *this,Instr *instr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  OpCode OVar5;
  uint32 index;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  RegOpnd *dstOpnd;
  Instr *pIVar8;
  Opnd *pOVar9;
  RegOpnd *pRVar10;
  Func *func;
  uint uVar11;
  IntConstType local_48;
  OpCode local_34;
  IRType local_31;
  
  this_00 = instr->m_dst;
  pRVar10 = (RegOpnd *)instr->m_src1;
  pOVar9 = instr->m_src2;
  if (((this_00 == (Opnd *)0x0) || (bVar3 = IR::Opnd::IsRegOpnd(this_00), !bVar3)) ||
     (((10 < this_00->m_type || ((0x688U >> (this_00->m_type & 0x1f) & 1) == 0)) &&
      (bVar3 = IR::Opnd::IsInt64(this_00), !bVar3)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x27f,
                       "(dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64()))"
                       ,
                       "dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64())"
                      );
    if (!bVar3) goto LAB_005e9eb8;
    *puVar6 = 0;
  }
  if (((pRVar10 == (RegOpnd *)0x0) || (bVar3 = IR::Opnd::IsRegOpnd((Opnd *)pRVar10), !bVar3)) ||
     (bVar3 = IR::Opnd::IsSimd128((Opnd *)pRVar10), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x280,"(src1 && src1->IsRegOpnd() && src1->IsSimd128())",
                       "src1 && src1->IsRegOpnd() && src1->IsSimd128()");
    if (!bVar3) goto LAB_005e9eb8;
    *puVar6 = 0;
  }
  if ((pOVar9 == (Opnd *)0x0) || (bVar3 = IR::Opnd::IsIntConstOpnd(pOVar9), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x281,"(src2 && src2->IsIntConstOpnd())","src2 && src2->IsIntConstOpnd()");
    if (!bVar3) goto LAB_005e9eb8;
    *puVar6 = 0;
  }
  pIVar7 = IR::Opnd::AsIntConstOpnd(pOVar9);
  index = IR::IntConstOpnd::AsUint32(pIVar7);
  OVar5 = instr->m_opcode;
  if (OVar5 == Simd128_ExtractLane_I2) {
    EmitExtractInt64(this,this_00,instr->m_src1,index,instr);
    local_31 = TyInt32;
    uVar11 = 0;
    local_48 = 0;
    bVar4 = false;
    bVar3 = false;
  }
  else {
    if (OVar5 == Simd128_ExtractLane_I16) {
LAB_005e9894:
      if (0xf < index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x29d,"(laneIndex < 16)","laneIndex < 16");
        if (!bVar3) goto LAB_005e9eb8;
        *puVar6 = 0;
      }
      uVar11 = index * 8 & 0x18;
      index = index >> 2;
      local_48 = 0xff;
      bVar3 = true;
      bVar4 = false;
      local_31 = TyInt8;
LAB_005e99a1:
      local_34 = MOVD;
      bVar2 = true;
LAB_005e9b00:
      if (index != 0) goto LAB_005e9b11;
    }
    else {
      if (OVar5 != Simd128_ExtractLane_I4) {
        if (OVar5 == Simd128_ExtractLane_B16) goto LAB_005e9894;
        if (OVar5 != Simd128_ExtractLane_I8) {
          if (OVar5 == Simd128_ExtractLane_U4) goto LAB_005e99a8;
          if (OVar5 != Simd128_ExtractLane_U8) {
            if (OVar5 == Simd128_ExtractLane_U16) goto LAB_005e9894;
            if (OVar5 == Simd128_ExtractLane_B4) goto LAB_005e99a8;
            if (OVar5 == Simd128_ExtractLane_B8) goto LAB_005e991f;
            if (OVar5 == Simd128_ExtractLane_F4) {
              if (3 < index) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar6 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                                   ,0x28d,"(laneIndex < 4)","laneIndex < 4");
                if (!bVar3) goto LAB_005e9eb8;
                local_34 = MOVSS;
                bVar2 = false;
                goto LAB_005e9a2a;
              }
            }
            else {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar6 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                                 ,0x2aa,"((0))","UNREACHED");
              if (!bVar3) goto LAB_005e9eb8;
              *puVar6 = 0;
            }
            local_34 = MOVSS;
            bVar3 = false;
            local_31 = TyInt32;
            bVar4 = false;
            local_48 = 0;
            uVar11 = 0;
            bVar2 = false;
            goto LAB_005e9b00;
          }
        }
LAB_005e991f:
        if (7 < index) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                             ,0x293,"(laneIndex < 8)","laneIndex < 8");
          if (!bVar3) goto LAB_005e9eb8;
          *puVar6 = 0;
        }
        uVar11 = (index & 1) << 4;
        index = index >> 1;
        local_48 = 0xffff;
        local_31 = TyInt16;
        bVar4 = true;
        bVar3 = false;
        goto LAB_005e99a1;
      }
LAB_005e99a8:
      if (index < 4) {
        local_34 = MOVD;
        bVar2 = true;
        bVar3 = false;
        local_31 = TyInt32;
        bVar4 = false;
        local_48 = 0;
        uVar11 = 0;
        goto LAB_005e9b00;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x2a7,"(laneIndex < 4)","laneIndex < 4");
      if (!bVar3) goto LAB_005e9eb8;
      bVar2 = true;
      local_34 = MOVD;
LAB_005e9a2a:
      *puVar6 = 0;
      local_31 = TyInt32;
      uVar11 = 0;
      local_48 = 0;
      bVar4 = false;
      bVar3 = false;
LAB_005e9b11:
      dstOpnd = IR::RegOpnd::New((pRVar10->super_Opnd).m_type,this->m_func);
      pIVar7 = IR::IntConstOpnd::New((ulong)(index << 2),TyInt8,this->m_func,true);
      pIVar8 = IR::Instr::New(PSRLDQ,&dstOpnd->super_Opnd,(Opnd *)pRVar10,&pIVar7->super_Opnd,
                              this->m_func);
      IR::Instr::InsertBefore(instr,pIVar8);
      Legalize<false>(pIVar8,false);
      pRVar10 = dstOpnd;
    }
    pOVar9 = this_00;
    if (!bVar2) {
      pOVar9 = IR::Opnd::UseWithNewType(this_00,(pRVar10->super_Opnd).m_type,this->m_func);
    }
    pIVar8 = IR::Instr::New(local_34,pOVar9,&pRVar10->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
  }
  OVar5 = instr->m_opcode;
  if (((OVar5 - 0x397 < 0x39) && ((0x100400000000001U >> ((ulong)(OVar5 - 0x397) & 0x3f) & 1) != 0))
     || ((OVar5 == Simd128_ExtractLane_I16 ||
         ((OVar5 == Simd128_ExtractLane_U8 || (OVar5 == Simd128_ExtractLane_I8)))))) {
    if (uVar11 != 0) {
      pIVar7 = IR::IntConstOpnd::New((ulong)uVar11,TyInt8,this->m_func,false);
      pIVar8 = IR::Instr::New(SHR,this_00,this_00,&pIVar7->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar8);
      Legalize<false>(pIVar8,false);
    }
    if (!bVar4 && !bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x2ce,"(laneType == TyInt8 || laneType == TyInt16)",
                         "laneType == TyInt8 || laneType == TyInt16");
      if (!bVar4) {
LAB_005e9eb8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    if ((instr->m_opcode == Simd128_ExtractLane_I8) || (instr->m_opcode == Simd128_ExtractLane_I16))
    {
      if (bVar3) {
        pRVar10 = IR::RegOpnd::New(TyInt8,this->m_func);
        pIVar8 = IR::Instr::New(MOV,&pRVar10->super_Opnd,this_00,this->m_func);
        IR::Instr::InsertBefore(instr,pIVar8);
        Legalize<false>(pIVar8,false);
        func = this->m_func;
        OVar5 = MOVSX;
      }
      else {
        pRVar10 = (RegOpnd *)IR::Opnd::UseWithNewType(this_00,local_31,this->m_func);
        func = this->m_func;
        OVar5 = MOVSXW;
      }
      pIVar8 = IR::Instr::New(OVar5,this_00,&pRVar10->super_Opnd,func);
    }
    else {
      pIVar7 = IR::IntConstOpnd::New(local_48,TyInt32,this->m_func,false);
      pIVar8 = IR::Instr::New(AND,this_00,this_00,&pIVar7->super_Opnd,this->m_func);
    }
    IR::Instr::InsertBefore(instr,pIVar8);
    Legalize<false>(pIVar8,false);
    OVar5 = instr->m_opcode;
  }
  if ((OVar5 - 0x3bb < 0x15) && ((0x100401U >> (OVar5 - 0x3bb & 0x1f) & 1) != 0)) {
    pRVar10 = IR::RegOpnd::New(TyInt8,this->m_func);
    pIVar8 = IR::Instr::New(CMP,this->m_func);
    pOVar9 = IR::Opnd::UseWithNewType(this_00,local_31,this->m_func);
    IR::Instr::SetSrc1(pIVar8,pOVar9);
    pIVar7 = IR::IntConstOpnd::New(0,local_31,this->m_func,true);
    IR::Instr::SetSrc2(pIVar8,&pIVar7->super_Opnd);
    IR::Instr::InsertBefore(instr,pIVar8);
    Legalize<false>(pIVar8,false);
    pIVar8 = IR::Instr::New(MOV,&pRVar10->super_Opnd,this_00,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
    Legalize<false>(pIVar8,false);
    pIVar8 = IR::Instr::New(SETNE,&pRVar10->super_Opnd,&pRVar10->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
    Legalize<false>(pIVar8,false);
    pIVar8 = IR::Instr::New(MOVSX,this_00,&pRVar10->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
  }
  pIVar8 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar8;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerLdLane(IR::Instr *instr)
{
    IR::Opnd* dst, *src1, *src2;
    Js::OpCode movOpcode = Js::OpCode::MOVSS;
    uint laneWidth = 0, laneIndex = 0, shamt = 0, mask = 0;
    IRType laneType = TyInt32;
    dst = instr->GetDst();
    src1 = instr->GetSrc1();
    src2 = instr->GetSrc2();

    Assert(dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64()));
    Assert(src1 && src1->IsRegOpnd() && src1->IsSimd128());
    Assert(src2 && src2->IsIntConstOpnd());


    laneIndex = (uint)src2->AsIntConstOpnd()->AsUint32();
    laneWidth = 4;
    switch (instr->m_opcode)
    {
    case Js::OpCode::Simd128_ExtractLane_I2:
        laneWidth = 8;
        break;
    case Js::OpCode::Simd128_ExtractLane_F4:
        movOpcode = Js::OpCode::MOVSS;
        Assert(laneIndex < 4);
        break;
    case Js::OpCode::Simd128_ExtractLane_I8:
    case Js::OpCode::Simd128_ExtractLane_U8:
    case Js::OpCode::Simd128_ExtractLane_B8:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 8);
        shamt = (laneIndex % 2) * 16;
        laneIndex = laneIndex / 2;
        laneType = TyInt16;
        mask = 0x0000ffff;
        break;
    case Js::OpCode::Simd128_ExtractLane_I16:
    case Js::OpCode::Simd128_ExtractLane_U16:
    case Js::OpCode::Simd128_ExtractLane_B16:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 16);
        shamt = (laneIndex % 4) * 8;
        laneIndex = laneIndex / 4;
        laneType = TyInt8;
        mask = 0x000000ff;
        break;
    case Js::OpCode::Simd128_ExtractLane_U4:
    case Js::OpCode::Simd128_ExtractLane_I4:
    case Js::OpCode::Simd128_ExtractLane_B4:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 4);
        break;
    default:
        Assert(UNREACHED);
    }

    if (laneWidth == 8) //Simd128_ExtractLane_I2
    {
        EmitExtractInt64(dst, instr->GetSrc1(), laneIndex, instr);
    }
    else
    {
        IR::Opnd* tmp = src1;
        if (laneIndex != 0)
        {
            // tmp = PSRLDQ src1, shamt
            tmp = IR::RegOpnd::New(src1->GetType(), m_func);
            IR::Instr *shiftInstr = IR::Instr::New(Js::OpCode::PSRLDQ, tmp, src1, IR::IntConstOpnd::New(laneWidth * laneIndex, TyInt8, m_func, true), m_func);
            instr->InsertBefore(shiftInstr);
            Legalize(shiftInstr);
        }
        // MOVSS/MOVSD/MOVD dst, tmp
        instr->InsertBefore(IR::Instr::New(movOpcode, movOpcode == Js::OpCode::MOVD ? dst : dst->UseWithNewType(tmp->GetType(), m_func), tmp, m_func));
    }

    // dst has the 4-byte lane
    if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_U8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B8 ||
        instr->m_opcode == Js::OpCode::Simd128_ExtractLane_U16 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I16 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B16)
    {
        // extract the 1/2 bytes sublane
        IR::Instr *newInstr = nullptr;
        if (shamt != 0)
        {
            // SHR dst, dst, shamt
            newInstr = IR::Instr::New(Js::OpCode::SHR, dst, dst, IR::IntConstOpnd::New((IntConstType)shamt, TyInt8, m_func), m_func);
            instr->InsertBefore(newInstr);
            Legalize(newInstr);
        }

        Assert(laneType == TyInt8 || laneType == TyInt16);
        // zero or sign-extend upper bits
        if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I16)
        {
            if (laneType == TyInt8)
            {
                IR::RegOpnd * tmp = IR::RegOpnd::New(TyInt8, m_func);
                newInstr = IR::Instr::New(Js::OpCode::MOV, tmp, dst, m_func);
                instr->InsertBefore(newInstr);
                Legalize(newInstr);
                newInstr = IR::Instr::New(Js::OpCode::MOVSX, dst, tmp, m_func);
            }
            else
            {
                newInstr = IR::Instr::New(Js::OpCode::MOVSXW, dst, dst->UseWithNewType(laneType, m_func), m_func);
            }
        }
        else
        {
            newInstr = IR::Instr::New(Js::OpCode::AND, dst, dst, IR::IntConstOpnd::New(mask, TyInt32, m_func), m_func);
        }

        instr->InsertBefore(newInstr);
        Legalize(newInstr);
    }
    if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B8 ||
        instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B16)
    {
        IR::Instr* pInstr = nullptr;
        IR::RegOpnd* tmp = IR::RegOpnd::New(TyInt8, m_func);

        // cmp      dst, 0
        pInstr = IR::Instr::New(Js::OpCode::CMP, m_func);
        pInstr->SetSrc1(dst->UseWithNewType(laneType, m_func));
        pInstr->SetSrc2(IR::IntConstOpnd::New(0, laneType, m_func, true));
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // mov     tmp(TyInt8), dst
        pInstr = IR::Instr::New(Js::OpCode::MOV, tmp, dst, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // setne     tmp(TyInt8)
        pInstr = IR::Instr::New(Js::OpCode::SETNE, tmp, tmp, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // movsx      dst, tmp(TyInt8)
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSX, dst, tmp, m_func));
    }

    IR::Instr* prevInstr = instr->m_prev;
    instr->Remove();
    return prevInstr;
}